

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

double * __thiscall
ON_PlaneEquation::ValueAt
          (ON_PlaneEquation *this,int Pcount,ON_3dPoint *P,double *value,double *value_range)

{
  double dVar1;
  double *e;
  double s;
  int i;
  double *value_range_local;
  double *value_local;
  ON_3dPoint *P_local;
  int Pcount_local;
  ON_PlaneEquation *this_local;
  
  if ((Pcount < 1) || (P == (ON_3dPoint *)0x0)) {
    this_local = (ON_PlaneEquation *)0x0;
  }
  else {
    value_range_local = value;
    if (value == (double *)0x0) {
      value_range_local = (double *)onmalloc((long)Pcount << 3);
    }
    if (value_range_local == (double *)0x0) {
      this_local = (ON_PlaneEquation *)0x0;
    }
    else {
      if (value_range == (double *)0x0) {
        for (s._4_4_ = 0; s._4_4_ < Pcount; s._4_4_ = s._4_4_ + 1) {
          value_range_local[s._4_4_] =
               this->z * P[s._4_4_].z + this->x * P[s._4_4_].x + this->y * P[s._4_4_].y + this->d;
        }
      }
      else {
        dVar1 = this->z * P->z + this->x * P->x + this->y * P->y + this->d;
        *value_range_local = dVar1;
        *value_range = dVar1;
        value_range[1] = dVar1;
        for (s._4_4_ = 1; s._4_4_ < Pcount; s._4_4_ = s._4_4_ + 1) {
          dVar1 = this->z * P[s._4_4_].z + this->x * P[s._4_4_].x + this->y * P[s._4_4_].y + this->d
          ;
          value_range_local[s._4_4_] = dVar1;
          if (*value_range <= dVar1) {
            if (value_range[1] <= dVar1 && dVar1 != value_range[1]) {
              value_range[1] = dVar1;
            }
          }
          else {
            *value_range = dVar1;
          }
        }
      }
      this_local = (ON_PlaneEquation *)value_range_local;
    }
  }
  return &this_local->x;
}

Assistant:

double* ON_PlaneEquation::ValueAt(
      int Pcount,
      const ON_3dPoint* P,
      double* value,
      double value_range[2]
      ) const
{
  if ( Pcount <= 0 || 0 == P )
    return 0;

  int i;
  double s;
  const double* e = &x;

  if ( 0 == value )
    value =  (double*)onmalloc(Pcount * sizeof(*value) );
  if ( 0 == value )
    return 0;

  if ( 0 != value_range )
  {
    value[0] = s = e[0]*(P[0].x) + e[1]*(P[0].y) + e[2]*(P[0].z) + e[3];
    value_range[0] = s;
    value_range[1] = s;
    for ( i = 1; i < Pcount; i++ )
    {
      value[i] = s = e[0]*(P[i].x) + e[1]*(P[i].y) + e[2]*(P[i].z) + e[3];
      if ( s < value_range[0] )
        value_range[0] = s;
      else if ( s > value_range[1] )
        value_range[1] = s;
    }
  }
  else
  {
    for ( i = 0; i < Pcount; i++ )
    {
      value[i] = e[0]*(P[i].x) + e[1]*(P[i].y) + e[2]*(P[i].z) + e[3];
    }
  }

  return value;
}